

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Maybe<kj::Own<kj::_::Event>_> __thiscall
kj::_::EagerPromiseNodeBase::fire(EagerPromiseNodeBase *this)

{
  ExceptionOrValue *this_00;
  PromiseNode *pPVar1;
  NullableValue<kj::Exception> *other;
  Exception *pEVar2;
  Type *func;
  Event *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event>_> MVar3;
  kj local_2e0 [8];
  Maybe<kj::Exception> local_2d8;
  undefined1 local_178 [8];
  NullableValue<kj::Exception> exception;
  EagerPromiseNodeBase *this_local;
  
  pPVar1 = Own<kj::_::PromiseNode>::operator->((Own<kj::_::PromiseNode> *)(in_RSI + 0x30));
  (*pPVar1->_vptr_PromiseNode[2])(pPVar1,*(undefined8 *)(in_RSI + 0x48));
  runCatchingExceptions<kj::_::EagerPromiseNodeBase::fire()::__0>(&local_2d8,local_2e0,func);
  other = readMaybe<kj::Exception>(&local_2d8);
  NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_178,other);
  Maybe<kj::Exception>::~Maybe(&local_2d8);
  pEVar2 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_178);
  if (pEVar2 != (Exception *)0x0) {
    this_00 = *(ExceptionOrValue **)(in_RSI + 0x48);
    pEVar2 = NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_178);
    pEVar2 = mv<kj::Exception>(pEVar2);
    ExceptionOrValue::addException(this_00,pEVar2);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_178);
  PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(in_RSI + 0x40));
  Maybe<kj::Own<kj::_::Event>_>::Maybe((Maybe<kj::Own<kj::_::Event>_> *)this,(void *)0x0);
  MVar3.ptr.ptr = extraout_RDX;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<Event>> EagerPromiseNodeBase::fire() {
  dependency->get(resultRef);
  KJ_IF_MAYBE(exception, kj::runCatchingExceptions([this]() {
    dependency = nullptr;
  })) {
    resultRef.addException(kj::mv(*exception));
  }

  onReadyEvent.arm();
  return nullptr;
}